

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::DoubleNearPredFormat
          (char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,double abs_error)

{
  uint uVar1;
  double *pdVar2;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  AssertionResult *value;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double __y;
  double dVar4;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  AssertionResult AVar5;
  double epsilon;
  double min_abs;
  double diff;
  char (*in_stack_fffffffffffffe28) [106];
  AssertionResult *in_stack_fffffffffffffe30;
  AssertionResult *in_stack_fffffffffffffe38;
  AssertionResult *in_stack_fffffffffffffe40;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  
  local_30 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_40 = ABS(in_XMM0_Qa - local_30);
  if (in_XMM2_Qa < local_40) {
    local_50 = ABS(in_XMM0_Qa);
    local_58 = ABS(local_30);
    local_38 = in_XMM2_Qa;
    local_28 = in_XMM0_Qa;
    pdVar2 = std::min<double>(&local_50,&local_58);
    dVar4 = *pdVar2;
    local_48 = dVar4;
    __y = std::numeric_limits<double>::infinity();
    dVar4 = nextafter(dVar4,__y);
    dVar4 = dVar4 - local_48;
    uVar1 = std::isnan(local_28);
    if ((uVar1 & 1) == 0) {
      uVar1 = std::isnan(local_30);
      if ((((uVar1 & 1) == 0) && (0.0 < local_38)) && (local_38 < dVar4)) {
        AssertionFailure();
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [24])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [6])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [5])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [9])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [15])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [3])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [15])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [27])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [15])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
        AssertionResult::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [100])in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
        AssertionResult::operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        AssertionResult::AssertionResult(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        AssertionResult::~AssertionResult((AssertionResult *)0x191b52);
        _Var3._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        goto LAB_00191df9;
      }
    }
    AssertionFailure();
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char (*) [24])in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char (*) [6])in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char (*) [5])in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char (*) [17])in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char (*) [9])in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
    AssertionResult::operator<<(in_stack_fffffffffffffe30,(char (*) [15])in_stack_fffffffffffffe28);
    this = AssertionResult::operator<<
                     (in_stack_fffffffffffffe30,(double *)in_stack_fffffffffffffe28);
    other = AssertionResult::operator<<
                      (in_stack_fffffffffffffe30,(char (*) [3])in_stack_fffffffffffffe28);
    this_00 = AssertionResult::operator<<
                        (in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
    value = AssertionResult::operator<<(this_00,(char (*) [15])in_stack_fffffffffffffe28);
    AssertionResult::operator<<(this_00,(double *)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(double *)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::AssertionResult(this,other);
    AssertionResult::~AssertionResult((AssertionResult *)0x191dd4);
    _Var3 = extraout_RDX_00.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
  }
  else {
    AVar5 = AssertionSuccess();
    _Var3._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar5.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
LAB_00191df9:
  AVar5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var3._M_head_impl;
  AVar5._0_8_ = in_RDI;
  return AVar5;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1,
                                     const char* expr2,
                                     const char* abs_error_expr,
                                     double val1,
                                     double val2,
                                     double abs_error) {
  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // Find the value which is closest to zero.
  const double min_abs = std::min(fabs(val1), fabs(val2));
  // Find the distance to the next double from that value.
  const double epsilon =
      nextafter(min_abs, std::numeric_limits<double>::infinity()) - min_abs;
  // Detect the case where abs_error is so small that EXPECT_NEAR is
  // effectively the same as EXPECT_EQUAL, and give an informative error
  // message so that the situation can be more easily understood without
  // requiring exotic floating-point knowledge.
  // Don't do an epsilon check if abs_error is zero because that implies
  // that an equality check was actually intended.
  if (!(std::isnan)(val1) && !(std::isnan)(val2) && abs_error > 0 &&
      abs_error < epsilon) {
    return AssertionFailure()
           << "The difference between " << expr1 << " and " << expr2 << " is "
           << diff << ", where\n"
           << expr1 << " evaluates to " << val1 << ",\n"
           << expr2 << " evaluates to " << val2 << ".\nThe abs_error parameter "
           << abs_error_expr << " evaluates to " << abs_error
           << " which is smaller than the minimum distance between doubles for "
              "numbers of this magnitude which is "
           << epsilon
           << ", thus making this EXPECT_NEAR check equivalent to "
              "EXPECT_EQUAL. Consider using EXPECT_DOUBLE_EQ instead.";
  }
  return AssertionFailure()
      << "The difference between " << expr1 << " and " << expr2
      << " is " << diff << ", which exceeds " << abs_error_expr << ", where\n"
      << expr1 << " evaluates to " << val1 << ",\n"
      << expr2 << " evaluates to " << val2 << ", and\n"
      << abs_error_expr << " evaluates to " << abs_error << ".";
}